

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall
miniros::Publication::addSubscriberLink(Publication *this,SubscriberLinkPtr *sub_link)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  value_type *in_RDI;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
  *in_stack_ffffffffffffffd0;
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  if (((ulong)in_RDI[0x13].super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi & 1) == 0) {
    std::
    vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ::push_back(in_stack_ffffffffffffffd0,in_RDI);
    peVar3 = std::
             __shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x488f43);
    uVar2 = (*peVar3->_vptr_SubscriberLink[6])();
    if ((uVar2 & 1) != 0) {
      *(int *)&in_RDI[0x17].super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi =
           *(int *)&in_RDI[0x17].
                    super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 1;
    }
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x488fa1);
  if (!bVar1) {
    if ((((ulong)in_RDI[0x13].
                 super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi & 0x100) != 0) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x14)), bVar1)) {
      peVar3 = std::
               __shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x488fdc);
      (*peVar3->_vptr_SubscriberLink[2])(peVar3,in_RDI + 0x14,1);
    }
    peerConnect(this,sub_link);
  }
  return;
}

Assistant:

void Publication::addSubscriberLink(const SubscriberLinkPtr& sub_link)
{
  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

    if (dropped_)
    {
      return;
    }

    subscriber_links_.push_back(sub_link);

    if (sub_link->isIntraprocess())
    {
      ++intraprocess_subscriber_count_;
    }
  }

  if (latch_ && last_message_.buf)
  {
    sub_link->enqueueMessage(last_message_, true, true);
  }

  // This call invokes the subscribe callback if there is one.
  // This must happen *after* the push_back above, in case the
  // callback uses publish().
  peerConnect(sub_link);
}